

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_fp_imm(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  _Bool _Var1;
  uint32_t reg;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint64_t val;
  TCGv_i64 v;
  int local_4c;
  MemOp sz;
  TCGv_i64 tcg_res;
  uint64_t imm;
  int mos;
  int type;
  int imm8;
  int imm5;
  int rd;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  reg = extract32(insn,0,5);
  uVar2 = extract32(insn,5,5);
  uVar3 = extract32(insn,0xd,8);
  uVar4 = extract32(insn,0x16,2);
  uVar5 = extract32(insn,0x1d,3);
  if ((uVar5 != 0) || (uVar2 != 0)) {
    unallocated_encoding_aarch64(s);
    return;
  }
  if (uVar4 == 0) {
    local_4c = 2;
  }
  else {
    if (uVar4 != 1) {
      if (uVar4 == 3) {
        local_4c = 1;
        _Var1 = isar_feature_aa64_fp16(s->isar);
        if (_Var1) goto LAB_0082a5cd;
      }
      unallocated_encoding_aarch64(s);
      return;
    }
    local_4c = 3;
  }
LAB_0082a5cd:
  _Var1 = fp_access_check(s);
  if (_Var1) {
    val = vfp_expand_imm_aarch64(local_4c,(uint8_t)uVar3);
    v = tcg_const_i64_aarch64(tcg_ctx_00,val);
    write_fp_dreg_aarch64(s,reg,v);
    tcg_temp_free_i64(tcg_ctx_00,v);
  }
  return;
}

Assistant:

static void disas_fp_imm(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int rd = extract32(insn, 0, 5);
    int imm5 = extract32(insn, 5, 5);
    int imm8 = extract32(insn, 13, 8);
    int type = extract32(insn, 22, 2);
    int mos = extract32(insn, 29, 3);
    uint64_t imm;
    TCGv_i64 tcg_res;
    MemOp sz;

    if (mos || imm5) {
        unallocated_encoding(s);
        return;
    }

    switch (type) {
    case 0:
        sz = MO_32;
        break;
    case 1:
        sz = MO_64;
        break;
    case 3:
        sz = MO_16;
        if (dc_isar_feature(aa64_fp16, s)) {
            break;
        }
        /* fallthru */
    default:
        unallocated_encoding(s);
        return;
    }

    if (!fp_access_check(s)) {
        return;
    }

    imm = vfp_expand_imm(sz, imm8);

    tcg_res = tcg_const_i64(tcg_ctx, imm);
    write_fp_dreg(s, rd, tcg_res);
    tcg_temp_free_i64(tcg_ctx, tcg_res);
}